

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall
dxil_spv::Converter::Impl::emit_execution_modes_node_output(Impl *this,MDNode *output)

{
  bool bVar1;
  Id id;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Builder *pBVar5;
  MDOperand *md;
  MDNode *node;
  uint uVar6;
  bool bVar8;
  bool is_rw_sharing;
  Id local_78;
  value_type local_74;
  Impl *local_68;
  Vector<NodeOutputMeta> *local_60;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *local_58;
  String name;
  ulong uVar7;
  
  local_74.is_recursive = false;
  local_74._9_3_ = 0;
  local_74.payload_stride = node_parse_payload_stride(output,&is_rw_sharing);
  pBVar5 = builder(this);
  id = spv::Builder::makeUintConstant(pBVar5,0,true);
  local_74.spec_constant_node_index = id;
  pBVar5 = builder(this);
  local_60 = &this->node_outputs;
  uVar6 = (int)(((long)(this->node_outputs).
                       super__Vector_base<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->node_outputs).
                      super__Vector_base<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0xc) + 100;
  uVar7 = (ulong)uVar6;
  local_78 = id;
  spv::Builder::addDecoration(pBVar5,id,DecorationSpecId,uVar6);
  uVar2 = LLVMBC::MDNode::getNumOperands(output);
  local_58 = &(this->node_input).node_id;
  local_68 = this;
  for (uVar6 = 1; uVar6 - 1 < uVar2; uVar6 = uVar6 + 2) {
    uVar3 = get_constant_metadata<unsigned_int>(output,uVar6 - 1);
    if (uVar3 == 0) {
      md = LLVMBC::MDNode::getOperand(output,uVar6);
      node = LLVMBC::cast<LLVMBC::MDNode>(md);
      bVar8 = false;
      get_string_metadata_abi_cxx11_(&name,(dxil_spv *)node,(MDNode *)0x0,(uint)uVar7);
      pBVar5 = builder(local_68);
      spv::Builder::addName(pBVar5,local_78,name._M_dataplus._M_p);
      bVar1 = std::operator==(&name,local_58);
      if (bVar1) {
        uVar3 = (local_68->node_input).node_array_index;
        uVar4 = get_constant_metadata<unsigned_int>(node,1);
        bVar8 = uVar3 == uVar4;
      }
      local_74.is_recursive = bVar8;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::_M_dispose
                (&name);
    }
  }
  std::
  vector<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
  ::push_back(local_60,&local_74);
  return true;
}

Assistant:

bool Converter::Impl::emit_execution_modes_node_output(llvm::MDNode *output)
{
	NodeOutputMeta output_meta = {};

	bool is_rw_sharing;
	output_meta.payload_stride = node_parse_payload_stride(output, is_rw_sharing);
	output_meta.spec_constant_node_index = builder().makeUintConstant(0, true);
	builder().addDecoration(output_meta.spec_constant_node_index, spv::DecorationSpecId,
	                        int(NodeSpecIdOutputBase + node_outputs.size()));

	uint32_t num_ops = output->getNumOperands();
	for (uint32_t i = 0; i < num_ops; i += 2)
	{
		auto tag = DXIL::NodeMetadataTag(get_constant_metadata(output, i));
		if (tag == DXIL::NodeMetadataTag::NodeOutputID)
		{
			auto *output_node = llvm::cast<llvm::MDNode>(output->getOperand(i + 1));
			String name = get_string_metadata(output_node, 0);
			builder().addName(output_meta.spec_constant_node_index, name.c_str());

			// FIXME: This is probably not accurate for arrayed nodes.
			// Can recursive nodes be arrayed? Seems very spicy ...
			output_meta.is_recursive =
				name == node_input.node_id &&
				node_input.node_array_index == get_constant_metadata(output_node, 1);
		}
	}

	node_outputs.push_back(output_meta);
	return true;
}